

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

size_t __thiscall
AccountingTestMemoryAllocator::removeHeadAndReturnSize(AccountingTestMemoryAllocator *this)

{
  long lVar1;
  size_t sVar2;
  long in_RDI;
  size_t size;
  AccountingTestMemoryAllocatorMemoryNode *foundNode;
  
  lVar1 = *(long *)(in_RDI + 0x38);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x10);
  sVar2 = *(size_t *)(lVar1 + 8);
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x18))
            (*(long **)(in_RDI + 0x30),lVar1,sVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
             ,0x292);
  return sVar2;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeHeadAndReturnSize()
{
    AccountingTestMemoryAllocatorMemoryNode* foundNode = head_;
    head_ = head_->next_;

    size_t size = foundNode->size_;
    originalAllocator_->free_memory((char*) foundNode, size, __FILE__, __LINE__);
    return size;
}